

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O0

int Dar_NewChoiceSynthesisGuard(Aig_Man_t *pAig)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  int local_20;
  int local_1c;
  int Count;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAig_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_1c);
    if (((pObj_00 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0)) &&
       (iVar1 = Aig_ObjRefs(pObj_00), 1000 < iVar1)) {
      iVar1 = Aig_ObjRefs(pObj_00);
      local_20 = iVar1 / 1000 + local_20;
    }
  }
  return (int)(10 < local_20);
}

Assistant:

int Dar_NewChoiceSynthesisGuard( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj;
    int i, Count = 0;
    Aig_ManForEachNode( pAig, pObj, i )
        if ( Aig_ObjRefs(pObj) > 1000 )
            Count += Aig_ObjRefs(pObj) / 1000;
    return (int)(Count > 10);
}